

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.c
# Opt level: O0

Tokenizer * tok_init(char *ifs)

{
  char *pcVar1;
  void *pvVar2;
  char *local_28;
  Tokenizer *tok;
  char *ifs_local;
  
  ifs_local = (char *)malloc(0x48);
  if ((long *)ifs_local == (long *)0x0) {
    ifs_local = (char *)0x0;
  }
  else {
    local_28 = ifs;
    if (ifs == (char *)0x0) {
      local_28 = "\t \n";
    }
    pcVar1 = strdup(local_28);
    *(char **)ifs_local = pcVar1;
    if (*(long *)ifs_local == 0) {
      free(ifs_local);
      ifs_local = (char *)0x0;
    }
    else {
      *(long *)((long)ifs_local + 8) = 0;
      *(long *)((long)ifs_local + 0x10) = 10;
      pvVar2 = malloc(*(long *)((long)ifs_local + 0x10) << 3);
      *(void **)((long)ifs_local + 0x18) = pvVar2;
      if (*(long *)((long)ifs_local + 0x18) == 0) {
        free(*(void **)ifs_local);
        free(ifs_local);
        ifs_local = (char *)0x0;
      }
      else {
        **(undefined8 **)((long)ifs_local + 0x18) = 0;
        pvVar2 = malloc(0x14);
        *(void **)((long)ifs_local + 0x38) = pvVar2;
        if (*(long *)((long)ifs_local + 0x38) == 0) {
          free(*(void **)((long)ifs_local + 0x18));
          free(*(void **)ifs_local);
          free(ifs_local);
          ifs_local = (char *)0x0;
        }
        else {
          *(long *)((long)ifs_local + 0x28) = *(long *)((long)ifs_local + 0x38) + 0x14;
          *(long *)((long)ifs_local + 0x30) = *(long *)((long)ifs_local + 0x38);
          *(long *)((long)ifs_local + 0x20) = *(long *)((long)ifs_local + 0x38);
          *(undefined4 *)((long)ifs_local + 0x44) = 0;
          *(undefined4 *)((long)ifs_local + 0x40) = 0;
        }
      }
    }
  }
  return (Tokenizer *)ifs_local;
}

Assistant:

TYPE(Tokenizer) *
FUN(tok,init)(const Char *ifs)
{
	TYPE(Tokenizer) *tok = tok_malloc(sizeof(*tok));

	if (tok == NULL)
		return NULL;
	tok->ifs = tok_strdup(ifs ? ifs : IFS);
	if (tok->ifs == NULL) {
		tok_free(tok);
		return NULL;
	}
	tok->argc = 0;
	tok->amax = AINCR;
	tok->argv = tok_malloc(sizeof(*tok->argv) * tok->amax);
	if (tok->argv == NULL) {
		tok_free(tok->ifs);
		tok_free(tok);
		return NULL;
	}
	tok->argv[0] = NULL;
	tok->wspace = tok_malloc(WINCR * sizeof(*tok->wspace));
	if (tok->wspace == NULL) {
		tok_free(tok->argv);
		tok_free(tok->ifs);
		tok_free(tok);
		return NULL;
	}
	tok->wmax = tok->wspace + WINCR;
	tok->wstart = tok->wspace;
	tok->wptr = tok->wspace;
	tok->flags = 0;
	tok->quote = Q_none;

	return tok;
}